

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_unary_exp(SyntaxAnalyze *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  SharedExNdPtr SVar5;
  SyntaxAnalyze *in_stack_00000168;
  string nodeId;
  SharedExNdPtr tmp;
  SharedExNdPtr child;
  string num;
  SharedExNdPtr *node;
  ValueMode in_stack_000009d4;
  SyntaxAnalyze *in_stack_000009d8;
  ExpressNode *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  SyntaxAnalyze *in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  SyntaxAnalyze *in_stack_fffffffffffffd70;
  Op in_stack_fffffffffffffe44;
  SharedExNdPtr *in_stack_fffffffffffffe48;
  SharedExNdPtr *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  SyntaxAnalyze *in_stack_fffffffffffffe60;
  string local_178 [48];
  string local_148 [4];
  Token in_stack_fffffffffffffebc;
  SyntaxAnalyze *in_stack_fffffffffffffec0;
  TyKind in_stack_fffffffffffffed4;
  SyntaxAnalyze *in_stack_fffffffffffffed8;
  string local_c8 [48];
  string local_98 [32];
  string local_78 [96];
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar6;
  
  uVar6 = 0;
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a67d7);
  bVar1 = try_word(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                   (Token)in_stack_fffffffffffffd58);
  if (bVar1) {
    match_one_word(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    gm_exp(in_stack_fffffffffffffed8);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a685c);
    match_one_word(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar1 = try_word(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                     (Token)in_stack_fffffffffffffd58);
    iVar2 = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    if (bVar1) {
      bVar1 = try_word(in_stack_fffffffffffffd60,iVar2,(Token)in_stack_fffffffffffffd58);
      if (bVar1) {
        gm_func_call(in_stack_00000168);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a6921);
        _Var4._M_pi = extraout_RDX_00;
      }
      else {
        gm_l_val(in_stack_000009d8,in_stack_000009d4);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a695e);
        _Var4._M_pi = extraout_RDX_01;
      }
    }
    else {
      bVar1 = try_word(in_stack_fffffffffffffd60,iVar2,(Token)in_stack_fffffffffffffd58);
      if (bVar1) {
        std::__cxx11::string::string(local_78);
        match_one_word(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        get_least_matched_word((SyntaxAnalyze *)0x2a69be);
        word::Word::get_self_abi_cxx11_((Word *)in_stack_fffffffffffffd48);
        std::__cxx11::string::operator=(local_78,local_98);
        std::__cxx11::string::~string(local_98);
        operator_new(0x48);
        express::ExpressNode::ExpressNode((ExpressNode *)in_stack_fffffffffffffd70);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                   in_stack_fffffffffffffd48);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a6a6d);
        std::__cxx11::string::string(local_c8,local_78);
        iVar2 = word::stringToInt(in_stack_fffffffffffffd50);
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6aa4);
        peVar3->_value = iVar2;
        std::__cxx11::string::~string(local_c8);
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6ac5);
        peVar3->_type = CNS;
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6ad8);
        peVar3->_operation = NUMBER;
        std::__cxx11::string::~string(local_78);
        _Var4._M_pi = extraout_RDX_02;
      }
      else {
        operator_new(0x48);
        express::ExpressNode::ExpressNode((ExpressNode *)in_stack_fffffffffffffd70);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                   in_stack_fffffffffffffd48);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a6bb7);
        bVar1 = try_word(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                         (Token)in_stack_fffffffffffffd68,
                         (Token)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                         (Token)in_stack_fffffffffffffd60);
        if (bVar1) {
          bVar1 = try_word(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20)
                           ,(Token)in_stack_fffffffffffffd58);
          if (bVar1) {
            match_one_word(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6c34);
            peVar3->_operation = UN_PLUS;
          }
          else {
            bVar1 = try_word(in_stack_fffffffffffffd60,
                             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                             (Token)in_stack_fffffffffffffd58);
            if (bVar1) {
              match_one_word(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
              peVar3 = std::
                       __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2a6cb0);
              peVar3->_operation = UN_MINU;
            }
            else {
              match_one_word(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
              peVar3 = std::
                       __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2a6cda);
              peVar3->_operation = UN_NOT;
            }
          }
        }
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a6cf2);
        if (peVar3->_operation == UN_PLUS) {
          gm_unary_exp((SyntaxAnalyze *)CONCAT17(uVar6,in_stack_ffffffffffffffe8));
          std::shared_ptr<front::express::ExpressNode>::operator=
                    ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                     (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a6d31);
          _Var4._M_pi = extraout_RDX_03;
        }
        else {
          gm_unary_exp((SyntaxAnalyze *)CONCAT17(uVar6,in_stack_ffffffffffffffe8));
          peVar3 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a6d5a);
          if (peVar3->_type == CNS) {
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6d70);
            peVar3->_type = CNS;
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6d83);
            if (peVar3->_operation == UN_MINU) {
              peVar3 = std::
                       __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2a6da9);
              iVar2 = peVar3->_value;
              peVar3 = std::
                       __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2a6dc2);
              peVar3->_value = -iVar2;
            }
            else if (peVar3->_operation == UN_NOT) {
              peVar3 = std::
                       __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2a6dd8);
              iVar2 = peVar3->_value;
              peVar3 = std::
                       __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2a6df7);
              peVar3->_value = (uint)((iVar2 != 0 ^ 0xffU) & 1);
            }
          }
          else {
            std::shared_ptr<front::express::ExpressNode>::shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a6e14);
            std::__cxx11::string::string((string *)&stack0xfffffffffffffed8);
            irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                      ((irGenerator *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
            std::__cxx11::string::operator=((string *)&stack0xfffffffffffffed8,local_148);
            std::__cxx11::string::~string(local_148);
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6e74);
            peVar3->_type = VAR;
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6e87);
            std::__cxx11::string::operator=
                      ((string *)&peVar3->_name,(string *)&stack0xfffffffffffffed8);
            operator_new(0x48);
            express::ExpressNode::ExpressNode((ExpressNode *)in_stack_fffffffffffffd70);
            std::shared_ptr<front::express::ExpressNode>::
            shared_ptr<front::express::ExpressNode,void>
                      ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                       in_stack_fffffffffffffd48);
            std::shared_ptr<front::express::ExpressNode>::operator=
                      ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                       (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
            std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a6eed);
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6efa);
            peVar3->_type = CNS;
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6f0d);
            peVar3->_operation = NUMBER;
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6f21);
            peVar3->_value = 0;
            peVar3 = std::
                     __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a6f35);
            if (peVar3->_operation == UN_MINU) {
              std::__cxx11::string::string(local_178,(string *)&stack0xfffffffffffffed8);
              std::shared_ptr<front::express::ExpressNode>::shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                         (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
              std::shared_ptr<front::express::ExpressNode>::shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                         (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
              hp_gn_binary_mir(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                               in_stack_fffffffffffffe44);
              std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)0x2a6fbe);
              std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)0x2a6fcb);
              std::__cxx11::string::~string(local_178);
            }
            else {
              std::__cxx11::string::string
                        ((string *)&stack0xfffffffffffffe48,(string *)&stack0xfffffffffffffed8);
              std::shared_ptr<front::express::ExpressNode>::shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                         (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
              std::shared_ptr<front::express::ExpressNode>::shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd50,
                         (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
              hp_gn_binary_mir(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                               in_stack_fffffffffffffe44);
              std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)0x2a70dd);
              std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                        ((shared_ptr<front::express::ExpressNode> *)0x2a70ea);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
            }
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
            std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a7150);
          }
          peVar3 = std::
                   __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a717b);
          std::shared_ptr<front::express::ExpressNode>::shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)peVar3,
                     (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffd48);
          express::ExpressNode::addChild(peVar3,(SharedExNdPtr *)in_stack_fffffffffffffd48);
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a71b8);
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a71c5);
          _Var4._M_pi = extraout_RDX_04;
        }
      }
    }
  }
  SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SharedExNdPtr)
         SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_unary_exp() {
  SharedExNdPtr node;

  if (try_word(1, Token::LPARENT)) {
    match_one_word(Token::LPARENT);

    node = gm_exp();

    match_one_word(Token::RPARENT);
  } else if (try_word(1, Token::IDENFR)) {
    if (try_word(2, Token::LPARENT)) {
      node = gm_func_call();
    } else {
      node = gm_l_val(ValueMode::right);
    }
  } else if (try_word(1, Token::INTCON)) {
    string num;
    match_one_word(Token::INTCON);
    num = get_least_matched_word().get_self();
    node = SharedExNdPtr(new ExpressNode());
    node->_value = front::word::stringToInt(num);
    node->_type = NodeType::CNS;
    node->_operation = OperationType::NUMBER;
  } else {
    node = SharedExNdPtr(new ExpressNode());
    if (try_word(1, Token::PLUS, Token::MINU, Token::NOT)) {
      if (try_word(1, Token::PLUS)) {
        match_one_word(Token::PLUS);
        node->_operation = OperationType::UN_PLUS;
      } else if (try_word(1, Token::MINU)) {
        match_one_word(Token::MINU);
        node->_operation = OperationType::UN_MINU;
      } else {
        match_one_word(Token::NOT);
        node->_operation = OperationType::UN_NOT;
      }
    }

    if (node->_operation == OperationType::UN_PLUS) {
      node = gm_unary_exp();
    } else {
      SharedExNdPtr child = gm_unary_exp();

      if (child->_type == NodeType::CNS) {
        node->_type = NodeType::CNS;
        switch (node->_operation) {
          case OperationType::UN_MINU:
            node->_value = -child->_value;
            break;
          case OperationType::UN_NOT:
            node->_value = !child->_value;
            break;
          default:
            break;
        }
      } else {
        SharedExNdPtr tmp;
        string nodeId;

        nodeId = irGenerator.getNewTmpValueName(TyKind::Int);
        node->_type = NodeType::VAR;
        node->_name = nodeId;

        tmp = SharedExNdPtr(new ExpressNode());
        tmp->_type = NodeType::CNS;
        tmp->_operation = OperationType::NUMBER;
        tmp->_value = 0;

        if (node->_operation == OperationType::UN_MINU) {
          hp_gn_binary_mir(nodeId, tmp, child, Op::Sub);
        } else {
          hp_gn_binary_mir(nodeId, tmp, child, Op::Eq);
        }
      }
      node->addChild(child);
    }
  }
  return node;
}